

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_propagation.cpp
# Opt level: O0

void __thiscall
mocker::SparseSimpleConstantPropagation::buildInstDefineAndInstsUse::anon_class_8_1_8991fb9c::
operator()(anon_class_8_1_8991fb9c *this,shared_ptr<mocker::ir::IRInst> *inst)

{
  SparseSimpleConstantPropagation *pSVar1;
  bool bVar2;
  element_type *this_00;
  string *__k;
  vector<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
  *this_01;
  undefined1 local_60 [8];
  shared_ptr<mocker::ir::Reg> p;
  shared_ptr<mocker::ir::Addr> *operand;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range2;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  shared_ptr<mocker::ir::IRInst> *inst_local;
  anon_class_8_1_8991fb9c *this_local;
  
  pSVar1 = this->this;
  operands.
  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)inst;
  ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       *)&__range2,inst);
  __end2 = std::
           vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
           ::begin((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    *)&__range2);
  operand = (shared_ptr<mocker::ir::Addr> *)
            std::
            vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ::end((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   *)&__range2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                     *)&operand), bVar2) {
    p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
         ::operator*(&__end2);
    ir::dycLocalReg((ir *)local_60,
                    (shared_ptr<mocker::ir::Addr> *)
                    p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if (bVar2) {
      this_00 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_60);
      __k = ir::Reg::getIdentifier_abi_cxx11_(this_00);
      this_01 = (vector<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                 *)std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>_>_>
                   ::operator[](&pSVar1->instsUse,__k);
      std::
      vector<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
      ::emplace_back<std::shared_ptr<mocker::ir::IRInst>const&>
                (this_01,(shared_ptr<mocker::ir::IRInst> *)
                         operands.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_60);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  ~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
           *)&__range2);
  return;
}

Assistant:

void SparseSimpleConstantPropagation::buildInstDefineAndInstsUse() {
  auto updateInstsUse = [&](const std::shared_ptr<ir::IRInst> &inst) {
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      if (auto p = ir::dycLocalReg(operand))
        instsUse[p->getIdentifier()].emplace_back(inst);
    }
  };

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      if (ir::dycGlobalReg(dest))
        continue;
      auto destName = dest->getIdentifier();
      instDefine.emplace(destName, inst);
      updateInstsUse(inst);
    }
  }
}